

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

rnnbitfield * parsebitfield(rnndb *db,char *file,xmlNode *node)

{
  xmlChar *__s1;
  rnndb *db_00;
  int iVar1;
  rnnbitfield *prVar2;
  uint64_t uVar3;
  bool bVar4;
  xmlNode *node_00;
  char *pcVar5;
  _xmlAttr *attr;
  _xmlNode *node_01;
  bool bVar6;
  
  prVar2 = (rnnbitfield *)calloc(0xe8,1);
  prVar2->file = file;
  attr = node->properties;
  if (attr == (_xmlAttr *)0x0) {
    bVar4 = true;
  }
  else {
    bVar6 = false;
    bVar4 = false;
    do {
      __s1 = attr->name;
      iVar1 = strcmp((char *)__s1,"name");
      if (iVar1 == 0) {
        pcVar5 = getattrib(db,file,(uint)node->line,attr);
        pcVar5 = strdup(pcVar5);
        prVar2->name = pcVar5;
      }
      else {
        iVar1 = strcmp((char *)__s1,"high");
        if (iVar1 == 0) {
          uVar3 = getnumattrib(db,file,(uint)node->line,attr);
          prVar2->high = (int)uVar3;
          bVar4 = true;
        }
        else {
          iVar1 = strcmp((char *)__s1,"low");
          if (iVar1 == 0) {
            uVar3 = getnumattrib(db,file,(uint)node->line,attr);
            prVar2->low = (int)uVar3;
          }
          else {
            iVar1 = strcmp((char *)__s1,"pos");
            if (iVar1 != 0) {
              iVar1 = strcmp((char *)__s1,"varset");
              if (iVar1 == 0) {
                pcVar5 = getattrib(db,file,(uint)node->line,attr);
                pcVar5 = strdup(pcVar5);
                (prVar2->varinfo).varsetstr = pcVar5;
              }
              else {
                iVar1 = strcmp((char *)__s1,"variants");
                if (iVar1 == 0) {
                  pcVar5 = getattrib(db,file,(uint)node->line,attr);
                  pcVar5 = strdup(pcVar5);
                  (prVar2->varinfo).variantsstr = pcVar5;
                }
                else {
                  iVar1 = trytypeattr(db,file,node,attr,&prVar2->typeinfo);
                  if (iVar1 == 0) {
                    fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for bitfield\n",file,
                            (ulong)node->line,attr->name);
                    db->estatus = 1;
                  }
                }
              }
              goto LAB_00105867;
            }
            uVar3 = getnumattrib(db,file,(uint)node->line,attr);
            prVar2->low = (int)uVar3;
            prVar2->high = (int)uVar3;
            bVar4 = true;
          }
          bVar6 = true;
        }
      }
LAB_00105867:
      attr = attr->next;
    } while (attr != (_xmlAttr *)0x0);
    bVar4 = !bVar6 || !bVar4;
  }
  node_01 = node->children;
  if (node_01 != (_xmlNode *)0x0) {
    do {
      if (((node_01->type == XML_ELEMENT_NODE) &&
          (iVar1 = trytypetag(db,file,node_01,&prVar2->typeinfo), iVar1 == 0)) &&
         (pcVar5 = file, iVar1 = trytop(db,file,node_01), iVar1 == 0)) {
        db_00 = (rnndb *)node_01->name;
        iVar1 = trydoc(db_00,pcVar5,node_00);
        if (iVar1 == 0) {
          fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)node_01->line,node->name,
                  db_00);
          db->estatus = 1;
        }
      }
      node_01 = node_01->next;
    } while (node_01 != (_xmlNode *)0x0);
  }
  bVar6 = prVar2->name == (char *)0x0;
  pcVar5 = "%s:%d: nameless bitfield\n";
  if (!bVar6) {
    pcVar5 = "%s:%d: bitfield has wrong placement\n";
  }
  if ((bVar6 || bVar4) ||
     (pcVar5 = "%s:%d: bitfield has wrong placement\n", prVar2->high < prVar2->low)) {
    prVar2 = (rnnbitfield *)0x0;
    fprintf(_stderr,pcVar5,file,(ulong)node->line);
    db->estatus = 1;
  }
  return prVar2;
}

Assistant:

static struct rnnbitfield *parsebitfield(struct rnndb *db, char *file, xmlNode *node) {
	struct rnnbitfield *bf = calloc(sizeof *bf, 1);
	bf->file = file;
	xmlAttr *attr = node->properties;
	int highok = 0, lowok = 0;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			bf->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "high")) {
			bf->high = getnumattrib(db, file, node->line, attr);
			highok = 1;
		} else if (!strcmp(attr->name, "low")) {
			bf->low = getnumattrib(db, file, node->line, attr);
			lowok = 1;
		} else if (!strcmp(attr->name, "pos")) {
			bf->high = bf->low = getnumattrib(db, file, node->line, attr);
			lowok = highok = 1;
		} else if (!strcmp(attr->name, "varset")) {
			bf->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			bf->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!trytypeattr(db, file, node, attr, &bf->typeinfo)) {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for bitfield\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytypetag(db, file, chain, &bf->typeinfo) && !trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
	if (!bf->name) {
		fprintf (stderr, "%s:%d: nameless bitfield\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else if (!highok || !lowok || bf->high < bf->low) {
		fprintf (stderr, "%s:%d: bitfield has wrong placement\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else {
		return bf;
	}
}